

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_tick.cpp
# Opt level: O1

void P_Ticker(void)

{
  DBot *pDVar1;
  bool bVar2;
  long lVar3;
  int *piVar4;
  player_t *player;
  
  FInterpolator::UpdateInterpolations(&interpolator);
  r_NoInterpolate = true;
  if (paused == 0) {
    bVar2 = P_CheckTickerPaused();
    if (!bVar2) {
      DPSprite::NewTick();
      if (((level.time & 3U) == 0) && ((bglobal._16_1_ & 2) != 0)) {
        bglobal._16_1_ = bglobal._16_1_ & 0xfd ^ 1;
      }
      piVar4 = &DAT_00a3937c;
      lVar3 = 0;
      do {
        if ((playeringame[lVar3] == true) && (*piVar4 != 0)) goto LAB_0054da7f;
        lVar3 = lVar3 + 1;
        piVar4 = piVar4 + 0xa8;
      } while (lVar3 != 8);
      lVar3 = 8;
LAB_0054da7f:
      if ((int)lVar3 == 8) {
        S_ResumeSound(false);
      }
      lVar3 = 0;
      P_ResetSightCounters(false);
      R_ClearInterpolationPath();
      r_NoInterpolate = false;
      P_ThinkParticles();
      player = (player_t *)&players;
      do {
        if (playeringame[lVar3] == true) {
          if (((bglobal._16_1_ & 1) != 0) &&
             (pDVar1 = (player->Bot).field_0.p, pDVar1 != (DBot *)0x0)) {
            if (((pDVar1->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) goto LAB_0054dae3;
            (player->Bot).field_0.p = (DBot *)0x0;
          }
          P_PlayerThink(player);
        }
LAB_0054dae3:
        lVar3 = lVar3 + 1;
        player = player + 1;
      } while (lVar3 != 8);
      (*(StatusBar->super_DObject)._vptr_DObject[7])();
      FLevelLocals::Tick(&level);
      DThinker::RunThinkers();
      if (((bglobal._16_1_ & 1) == 0) && (((byte)level.flags2 & 0x20) == 0)) {
        P_UpdateSpecials();
        P_RunEffects();
      }
      level.time = level.time + 1;
      level.maptime = level.maptime + 1;
      level.totaltime = level.totaltime + 1;
    }
  }
  return;
}

Assistant:

void P_Ticker (void)
{
	int i;

	interpolator.UpdateInterpolations ();
	r_NoInterpolate = true;

	if (!demoplayback)
	{
		// This is a separate slot from the wipe in D_Display(), because this
		// is delayed slightly due to latency. (Even on a singleplayer game!)
//		GSnd->SetSfxPaused(!!playerswiping, 2);
	}

	// run the tic
	if (paused || P_CheckTickerPaused())
		return;

	DPSprite::NewTick();

	// [RH] Frozen mode is only changed every 4 tics, to make it work with A_Tracer().
	if ((level.time & 3) == 0)
	{
		if (bglobal.changefreeze)
		{
			bglobal.freeze ^= 1;
			bglobal.changefreeze = 0;
		}
	}

	// [BC] Do a quick check to see if anyone has the freeze time power. If they do,
	// then don't resume the sound, since one of the effects of that power is to shut
	// off the music.
	for (i = 0; i < MAXPLAYERS; i++ )
	{
		if (playeringame[i] && players[i].timefreezer != 0)
			break;
	}

	if ( i == MAXPLAYERS )
		S_ResumeSound (false);

	P_ResetSightCounters (false);
	R_ClearInterpolationPath();

	// Since things will be moving, it's okay to interpolate them in the renderer.
	r_NoInterpolate = false;

	P_ThinkParticles();	// [RH] make the particles think

	for (i = 0; i<MAXPLAYERS; i++)
		if (playeringame[i] &&
			/*Added by MC: Freeze mode.*/!(bglobal.freeze && players[i].Bot != NULL))
			P_PlayerThink (&players[i]);

	StatusBar->Tick ();		// [RH] moved this here
	level.Tick ();			// [RH] let the level tick
	DThinker::RunThinkers ();

	//if added by MC: Freeze mode.
	if (!bglobal.freeze && !(level.flags2 & LEVEL2_FROZEN))
	{
		P_UpdateSpecials ();
		P_RunEffects ();	// [RH] Run particle effects
	}

	// for par times
	level.time++;
	level.maptime++;
	level.totaltime++;
}